

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O0

int os_system_linux_netlink_add(os_system_netlink *nl,int protocol)

{
  oonf_log_source oVar1;
  char *pcVar2;
  int __fd;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  nlmsghdr *pnVar6;
  list_entity *plVar7;
  undefined4 local_b4;
  int fd;
  int recvbuf;
  sockaddr_nl addr;
  int protocol_local;
  os_system_netlink *nl_local;
  
  addr.nl_pid = protocol;
  unique0x100005b8 = nl;
  __fd = socket(0x10,3,protocol);
  if (__fd < 0) {
    if ((log_global_mask[stack0xffffffffffffff60->used_by->logging] & 4) != 0) {
      oVar1 = stack0xffffffffffffff60->used_by->logging;
      pcVar2 = stack0xffffffffffffff60->name;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      piVar4 = __errno_location();
      oonf_log(LOG_SEVERITY_WARN,oVar1,"src/base/os_linux/os_system_linux.c",0x103,(void *)0x0,0,
               "Cannot open netlink socket \'%s\': %s (%d)",pcVar2,pcVar5,*piVar4);
    }
  }
  else {
    (stack0xffffffffffffff60->socket).fd.fd = __fd;
    (stack0xffffffffffffff60->socket).fd._flags = OS_FD_ACTIVE;
    iVar3 = abuf_init(&stack0xffffffffffffff60->out);
    if (iVar3 == 0) {
      abuf_memcpy(&stack0xffffffffffffff60->out,&_dummy_buffer,0x18);
      iVar3 = getpagesize();
      pnVar6 = (nlmsghdr *)calloc(1,(long)iVar3);
      stack0xffffffffffffff60->in = pnVar6;
      if (stack0xffffffffffffff60->in == (nlmsghdr *)0x0) {
        if ((log_global_mask[stack0xffffffffffffff60->used_by->logging] & 4) != 0) {
          oonf_log(LOG_SEVERITY_WARN,stack0xffffffffffffff60->used_by->logging,
                   "src/base/os_linux/os_system_linux.c",0x116,(void *)0x0,0,
                   "Not enough memory for netlink \'%s\' input buffer",stack0xffffffffffffff60->name
                  );
        }
      }
      else {
        iVar3 = getpagesize();
        stack0xffffffffffffff60->in_len = (long)iVar3;
        memset(&fd,0,0xc);
        fd._0_2_ = 0x10;
        local_b4 = 0x100000;
        iVar3 = setsockopt((stack0xffffffffffffff60->socket).fd.fd,1,8,&local_b4,4);
        if ((iVar3 != 0) && ((log_global_mask[stack0xffffffffffffff60->used_by->logging] & 4) != 0))
        {
          oVar1 = stack0xffffffffffffff60->used_by->logging;
          pcVar2 = stack0xffffffffffffff60->name;
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          piVar4 = __errno_location();
          oonf_log(LOG_SEVERITY_WARN,oVar1,"src/base/os_linux/os_system_linux.c",0x124,(void *)0x0,0
                   ,"Cannot setup receive buffer size for netlink socket \'%s\': %s (%d)\n",pcVar2,
                   pcVar5,*piVar4);
        }
        iVar3 = bind((stack0xffffffffffffff60->socket).fd.fd,(sockaddr *)&fd,0xc);
        if (-1 < iVar3) {
          (stack0xffffffffffffff60->socket).name = "os_system_netlink";
          (stack0xffffffffffffff60->socket).process = _netlink_handler;
          oonf_socket_add(&stack0xffffffffffffff60->socket);
          oonf_socket_set_read(&stack0xffffffffffffff60->socket,true);
          (stack0xffffffffffffff60->timeout).class = &_netlink_timer;
          plVar7 = &stack0xffffffffffffff60->buffered;
          (stack0xffffffffffffff60->buffered).prev = plVar7;
          plVar7->next = plVar7;
          return 0;
        }
        if ((log_global_mask[stack0xffffffffffffff60->used_by->logging] & 4) != 0) {
          oVar1 = stack0xffffffffffffff60->used_by->logging;
          pcVar2 = stack0xffffffffffffff60->name;
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          piVar4 = __errno_location();
          oonf_log(LOG_SEVERITY_WARN,oVar1,"src/base/os_linux/os_system_linux.c",0x129,(void *)0x0,0
                   ,"Could not bind netlink socket %s: %s (%d)",pcVar2,pcVar5,*piVar4);
        }
      }
    }
    else if ((log_global_mask[stack0xffffffffffffff60->used_by->logging] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,stack0xffffffffffffff60->used_by->logging,
               "src/base/os_linux/os_system_linux.c",0x10f,(void *)0x0,0,
               "Not enough memory for netlink \'%s\'output buffer",stack0xffffffffffffff60->name);
    }
  }
  memset(&(stack0xffffffffffffff60->socket).fd,0,0x10);
  if (__fd != -1) {
    close(__fd);
  }
  free(stack0xffffffffffffff60->in);
  abuf_free(&stack0xffffffffffffff60->out);
  return -1;
}

Assistant:

int
os_system_linux_netlink_add(struct os_system_netlink *nl, int protocol) {
  struct sockaddr_nl addr;
  int recvbuf;
  int fd;

  fd = socket(PF_NETLINK, SOCK_RAW, protocol);
  if (fd < 0) {
    OONF_WARN(nl->used_by->logging, "Cannot open netlink socket '%s': %s (%d)", nl->name, strerror(errno), errno);
    goto os_add_netlink_fail;
  }

  if (os_fd_init(&nl->socket.fd, fd)) {
    OONF_WARN(nl->used_by->logging, "Could not initialize socket representation");
    goto os_add_netlink_fail;
  }
  if (abuf_init(&nl->out)) {
    OONF_WARN(nl->used_by->logging,
      "Not enough memory for"
      " netlink '%s'output buffer",
      nl->name);
    goto os_add_netlink_fail;
  }
  abuf_memcpy(&nl->out, &_dummy_buffer, sizeof(_dummy_buffer));

  nl->in = calloc(1, getpagesize());
  if (nl->in == NULL) {
    OONF_WARN(nl->used_by->logging, "Not enough memory for netlink '%s' input buffer", nl->name);
    goto os_add_netlink_fail;
  }
  nl->in_len = getpagesize();

  memset(&addr, 0, sizeof(addr));
  addr.nl_family = AF_NETLINK;

#if defined(SO_RCVBUF)
  recvbuf = 65536 * 16;
  if (setsockopt(nl->socket.fd.fd, SOL_SOCKET, SO_RCVBUF, &recvbuf, sizeof(recvbuf))) {
    OONF_WARN(nl->used_by->logging,
      "Cannot setup receive buffer size for"
      " netlink socket '%s': %s (%d)\n",
      nl->name, strerror(errno), errno);
  }
#endif

  if (bind(nl->socket.fd.fd, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
    OONF_WARN(nl->used_by->logging, "Could not bind netlink socket %s: %s (%d)", nl->name, strerror(errno), errno);
    goto os_add_netlink_fail;
  }

  nl->socket.name = "os_system_netlink";
  nl->socket.process = _netlink_handler;
  oonf_socket_add(&nl->socket);
  oonf_socket_set_read(&nl->socket, true);

  nl->timeout.class = &_netlink_timer;

  list_init_head(&nl->buffered);
  return 0;

os_add_netlink_fail:
  os_fd_invalidate(&nl->socket.fd);
  if (fd != -1) {
    close(fd);
  }
  free(nl->in);
  abuf_free(&nl->out);
  fd = -1;
  return -1;
}